

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

void rhash_md5_update(md5_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t __n;
  md5_ctx *x;
  ulong uVar9;
  md5_ctx *__src;
  bool bVar10;
  
  uVar1 = ctx->length;
  ctx->length = uVar1 + size;
  if ((uVar1 & 0x3f) != 0) {
    uVar9 = (ulong)(0x40 - ((uint)uVar1 & 0x3f));
    __n = size;
    if (uVar9 < size) {
      __n = uVar9;
    }
    memcpy((void *)((long)ctx->message + (ulong)((uint)uVar1 & 0x3f)),msg,__n);
    bVar10 = size < uVar9;
    size = size - uVar9;
    if (bVar10) {
      return;
    }
    rhash_md5_process_block(ctx->hash,ctx->message);
    msg = msg + uVar9;
  }
  __src = (md5_ctx *)msg;
  for (; 0x3f < size; size = size - 0x40) {
    x = __src;
    if (((ulong)msg & 3) != 0) {
      uVar2 = *(undefined8 *)__src->message;
      uVar3 = *(undefined8 *)(__src->message + 2);
      uVar4 = *(undefined8 *)(__src->message + 4);
      uVar5 = *(undefined8 *)(__src->message + 6);
      uVar6 = *(undefined8 *)(__src->message + 8);
      uVar7 = *(undefined8 *)(__src->message + 10);
      uVar8 = *(undefined8 *)(__src->message + 0xe);
      *(undefined8 *)(ctx->message + 0xc) = *(undefined8 *)(__src->message + 0xc);
      *(undefined8 *)(ctx->message + 0xe) = uVar8;
      *(undefined8 *)(ctx->message + 8) = uVar6;
      *(undefined8 *)(ctx->message + 10) = uVar7;
      *(undefined8 *)(ctx->message + 4) = uVar4;
      *(undefined8 *)(ctx->message + 6) = uVar5;
      *(undefined8 *)ctx->message = uVar2;
      *(undefined8 *)(ctx->message + 2) = uVar3;
      x = ctx;
    }
    rhash_md5_process_block(ctx->hash,x->message);
    __src = (md5_ctx *)&__src->length;
  }
  if (size == 0) {
    return;
  }
  memcpy(ctx,__src,size);
  return;
}

Assistant:

void rhash_md5_update(md5_ctx* ctx, const unsigned char* msg, size_t size)
{
	unsigned index = (unsigned)ctx->length & 63;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		unsigned left = md5_block_size - index;
		le32_copy((char*)ctx->message, index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_md5_process_block(ctx->hash, ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= md5_block_size) {
		unsigned* aligned_message_block;
		if (IS_LITTLE_ENDIAN && IS_ALIGNED_32(msg)) {
			/* the most common case is processing a 32-bit aligned message
			on a little-endian CPU without copying it */
			aligned_message_block = (unsigned*)msg;
		} else {
			le32_copy(ctx->message, 0, msg, md5_block_size);
			aligned_message_block = ctx->message;
		}

		rhash_md5_process_block(ctx->hash, aligned_message_block);
		msg  += md5_block_size;
		size -= md5_block_size;
	}
	if (size) {
		/* save leftovers */
		le32_copy(ctx->message, 0, msg, size);
	}
}